

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444.c
# Opt level: O0

int rfc7181_metric_encode(rfc7181_metric_field *encoded,uint32_t decoded)

{
  uint8_t local_1d;
  uint local_1c;
  uint8_t b;
  uint8_t a;
  uint32_t decoded_local;
  rfc7181_metric_field *encoded_local;
  
  if ((decoded == 0) || (0xfffffe < decoded)) {
    encoded_local._4_4_ = -1;
  }
  else if (decoded < 0xffff01) {
    local_1d = '\0';
    for (local_1c = decoded + 0x100; 0x200 < local_1c; local_1c = local_1c + 1 >> 1) {
      local_1d = local_1d + '\x01';
    }
    encoded->b[0] = local_1d;
    encoded->b[1] = (char)local_1c + 0xff;
    encoded_local._4_4_ = 0;
  }
  else {
    encoded->b[0] = '\x0f';
    encoded->b[1] = 0xff;
    encoded_local._4_4_ = 0;
  }
  return encoded_local._4_4_;
}

Assistant:

int
rfc7181_metric_encode(struct rfc7181_metric_field *encoded, uint32_t decoded) {
  uint8_t a, b;
  /*
   * metric-value := (257+b)2^a - 256
   * metric-code := 256 * a + b
   */

  if (decoded < RFC7181_METRIC_MIN || decoded >= RFC7181_METRIC_INFINITE) {
    return -1;
  }
  if (decoded > RFC7181_METRIC_MAX) {
    encoded->b[0] = 0x0f;
    encoded->b[1] = 0xff;
    return 0;
  }

  /* metric-value + 256 = (257+b)<<a */
  decoded += 256;

  a = 0;
  while (decoded > 512) {
    a++;

    /* divide by 2 and round up */
    decoded++;
    decoded >>= 1;
  }

  b = decoded - 257;

  encoded->b[0] = a;
  encoded->b[1] = b;

  return 0;
}